

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.cpp
# Opt level: O3

string * __thiscall
deqp::gls::fboc::details::AttachmentParams::getName_abi_cxx11_
          (string *__return_storage_ptr__,AttachmentParams *this,AttachmentParams *params)

{
  size_type *psVar1;
  long *plVar2;
  undefined8 *puVar3;
  ulong *puVar4;
  ulong uVar5;
  undefined8 uVar6;
  long *local_148;
  undefined8 local_140;
  long local_138;
  undefined8 uStack_130;
  long *local_128;
  undefined8 local_120;
  long local_118;
  undefined8 uStack_110;
  ulong *local_108;
  long local_100;
  ulong local_f8;
  long lStack_f0;
  ulong *local_e8;
  long local_e0;
  ulong local_d8;
  long lStack_d0;
  ulong *local_c8;
  long local_c0;
  ulong local_b8;
  long lStack_b0;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  attTypeName_abi_cxx11_(&local_48,(details *)(ulong)this->color0Kind,(GLenum)params);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_48);
  puVar4 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar4) {
    local_f8 = *puVar4;
    lStack_f0 = plVar2[3];
    local_108 = &local_f8;
  }
  else {
    local_f8 = *puVar4;
    local_108 = (ulong *)*plVar2;
  }
  local_100 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  attTypeName_abi_cxx11_(&local_68,(details *)(ulong)this->colornKind,(GLenum)local_100);
  uVar5 = 0xf;
  if (local_108 != &local_f8) {
    uVar5 = local_f8;
  }
  if (uVar5 < local_68._M_string_length + local_100) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      uVar6 = local_68.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar6 < local_68._M_string_length + local_100) goto LAB_0045de0b;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_108);
  }
  else {
LAB_0045de0b:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_68._M_dataplus._M_p);
  }
  local_148 = &local_138;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_138 = *plVar2;
    uStack_130 = puVar3[3];
  }
  else {
    local_138 = *plVar2;
    local_148 = (long *)*puVar3;
  }
  local_140 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_148);
  puVar4 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar4) {
    local_d8 = *puVar4;
    lStack_d0 = plVar2[3];
    local_e8 = &local_d8;
  }
  else {
    local_d8 = *puVar4;
    local_e8 = (ulong *)*plVar2;
  }
  local_e0 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  attTypeName_abi_cxx11_(&local_88,(details *)(ulong)this->depthKind,(GLenum)local_e0);
  uVar5 = 0xf;
  if (local_e8 != &local_d8) {
    uVar5 = local_d8;
  }
  if (uVar5 < local_88._M_string_length + local_e0) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      uVar6 = local_88.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar6 < local_88._M_string_length + local_e0) goto LAB_0045df27;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_e8);
  }
  else {
LAB_0045df27:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_88._M_dataplus._M_p);
  }
  local_128 = &local_118;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_118 = *plVar2;
    uStack_110 = puVar3[3];
  }
  else {
    local_118 = *plVar2;
    local_128 = (long *)*puVar3;
  }
  local_120 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_128);
  puVar4 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar4) {
    local_b8 = *puVar4;
    lStack_b0 = plVar2[3];
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *puVar4;
    local_c8 = (ulong *)*plVar2;
  }
  local_c0 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  attTypeName_abi_cxx11_(&local_a8,(details *)(ulong)this->stencilKind,(GLenum)local_c0);
  uVar5 = 0xf;
  if (local_c8 != &local_b8) {
    uVar5 = local_b8;
  }
  if (uVar5 < local_a8._M_string_length + local_c0) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      uVar6 = local_a8.field_2._M_allocated_capacity;
    }
    if (local_a8._M_string_length + local_c0 <= (ulong)uVar6) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,(ulong)local_c8);
      goto LAB_0045e07a;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_a8._M_dataplus._M_p);
LAB_0045e07a:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar3 + 2;
  if ((size_type *)*puVar3 == psVar1) {
    uVar6 = puVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar6;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar3[1];
  *puVar3 = psVar1;
  puVar3[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,local_b8 + 1);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,local_118 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,local_d8 + 1);
  }
  if (local_148 != &local_138) {
    operator_delete(local_148,local_138 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_108 != &local_f8) {
    operator_delete(local_108,local_f8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string AttachmentParams::getName (const AttachmentParams& params)
{
	return (attTypeName(params.color0Kind) + "_" +
			attTypeName(params.colornKind) + "_" +
			attTypeName(params.depthKind) + "_" +
			attTypeName(params.stencilKind));
}